

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductData.cpp
# Opt level: O0

void __thiscall
OpticsParser::WLData::WLData
          (WLData *this,double wavelength,double tfDirect,double tfDiffuse,double tbDirect,
          double tbDiffuse,double rfDirect,double rfDiffuse,double rbDirect,double rbDiffuse)

{
  MeasurementComponent local_90;
  MeasurementComponent local_70;
  double local_50;
  double rbDirect_local;
  double rfDiffuse_local;
  double rfDirect_local;
  double tbDiffuse_local;
  double tbDirect_local;
  double tfDiffuse_local;
  double tfDirect_local;
  double wavelength_local;
  WLData *this_local;
  
  this->wavelength = wavelength;
  local_70.tf = tfDirect;
  local_70.tb = tbDirect;
  local_70.rf = rfDirect;
  local_70.rb = rbDirect;
  local_50 = rbDirect;
  rbDirect_local = rfDiffuse;
  rfDiffuse_local = rfDirect;
  rfDirect_local = tbDiffuse;
  tbDiffuse_local = tbDirect;
  tbDirect_local = tfDiffuse;
  tfDiffuse_local = tfDirect;
  tfDirect_local = wavelength;
  wavelength_local = (double)this;
  std::optional<OpticsParser::MeasurementComponent>::
  optional<OpticsParser::MeasurementComponent,_true>(&this->directComponent,&local_70);
  local_90.tf = tbDirect_local;
  local_90.tb = rfDirect_local;
  local_90.rf = rbDirect_local;
  local_90.rb = rbDiffuse;
  std::optional<OpticsParser::MeasurementComponent>::
  optional<OpticsParser::MeasurementComponent,_true>(&this->diffuseComponent,&local_90);
  std::optional<OpticsParser::PVWavelengthData>::optional(&this->pvComponent);
  return;
}

Assistant:

OpticsParser::WLData::WLData(double wavelength,
                             double tfDirect,
                             double tfDiffuse,
                             double tbDirect,
                             double tbDiffuse,
                             double rfDirect,
                             double rfDiffuse,
                             double rbDirect,
                             double rbDiffuse) :
    wavelength(wavelength),
    directComponent(MeasurementComponent{tfDirect, tbDirect, rfDirect, rbDirect}),
    diffuseComponent(MeasurementComponent{tfDiffuse, tbDiffuse, rfDiffuse, rbDiffuse})
{}